

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * chck_cstr_replace_char(char *cstr,char replace,char with)

{
  char *__s;
  
  if ((cstr != (char *)0x0) && (replace != with)) {
    __s = cstr;
    while( true ) {
      __s = strchr(__s,(int)replace);
      if (__s == (char *)0x0) break;
      *__s = with;
    }
    return cstr;
  }
  __assert_fail("cstr && replace != with",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/string/string.c"
                ,0x8d,"char *chck_cstr_replace_char(char *, char, char)");
}

Assistant:

char*
chck_cstr_replace_char(char *cstr, char replace, char with)
{
   assert(cstr && replace != with);

   if (replace == with)
      return cstr;

   char *s = cstr;
   while ((s = strchr(s, replace)))
      *s = with;
   return cstr;
}